

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

void __thiscall
StringFormatter::format
          (StringFormatter *this,Value *value,function<void_(const_char_*,_unsigned_long)> *output)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  int iVar4;
  element_type *peVar5;
  pointer ppVar6;
  reference pVVar7;
  time_t t;
  char *pcVar8;
  size_t sVar9;
  double dVar10;
  Date local_290;
  String local_288;
  function<void_(const_char_*,_unsigned_long)> local_268;
  __normal_iterator<const_Value_*,_std::vector<Value,_std::allocator<Value>_>_> local_248;
  const_iterator it_1;
  const_iterator cStack_238;
  bool first;
  const_iterator end_1;
  function<void_(const_char_*,_unsigned_long)> local_228;
  undefined1 local_208 [8];
  String s;
  const_iterator it;
  List<String> strings;
  const_iterator end;
  String local_1b0;
  String local_190;
  unsigned_long local_170;
  size_t w_1;
  char buf_1 [128];
  size_t w;
  char buf [128];
  undefined1 local_40 [8];
  String str;
  function<void_(const_char_*,_unsigned_long)> *output_local;
  Value *value_local;
  StringFormatter *this_local;
  
  str.mString.field_2._8_8_ = output;
  String::String((String *)local_40,(char *)0x0,0xffffffffffffffff);
  TVar2 = Value::type(value);
  switch(TVar2) {
  case Type_Invalid:
  case Type_Undefined:
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output,"null",4);
    break;
  case Type_Boolean:
    bVar1 = Value::toBool(value);
    if (bVar1) {
      std::function<void_(const_char_*,_unsigned_long)>::operator()(output,"true",4);
    }
    else {
      std::function<void_(const_char_*,_unsigned_long)>::operator()(output,"false",5);
    }
    break;
  case Type_Integer:
    uVar3 = Value::toInteger(value);
    iVar4 = snprintf((char *)&w,0x80,"%d",(ulong)uVar3);
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output,(char *)&w,(long)iVar4);
    break;
  case Type_Double:
    dVar10 = Value::toDouble(value);
    iVar4 = snprintf((char *)&w_1,0x80,"%g",dVar10);
    local_170 = (unsigned_long)iVar4;
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output,(char *)&w_1,local_170);
    break;
  case Type_String:
    Value::toString(&local_190,value);
    String::operator=((String *)local_40,&local_190);
    String::~String(&local_190);
    break;
  case Type_Custom:
    Value::toCustom((Value *)&end);
    peVar5 = std::__shared_ptr_access<Value::Custom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Value::Custom,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&end);
    (**(code **)(*(long *)peVar5 + 0x10))(&local_1b0);
    String::operator=((String *)local_40,&local_1b0);
    String::~String(&local_1b0);
    std::shared_ptr<Value::Custom>::~shared_ptr((shared_ptr<Value::Custom> *)&end);
    break;
  case Type_Map:
    strings.super_vector<String,_std::allocator<String>_>.
    super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)Value::end(value);
    List<String>::List((List<String> *)&it);
    this->indent = this->indent + 1;
    s.mString.field_2._8_8_ = Value::begin(value);
    while (bVar1 = std::operator!=((_Self *)((long)&s.mString.field_2 + 8),
                                   (_Self *)&strings.super_vector<String,_std::allocator<String>_>.
                                             super__Vector_base<String,_std::allocator<String>_>.
                                             _M_impl.super__Vector_impl_data._M_end_of_storage),
          bVar1) {
      iVar4 = this->indent;
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_String,_Value>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_String,_Value>_> *)
                          ((long)&s.mString.field_2 + 8));
      pcVar8 = String::constData(&ppVar6->first);
      String::format<128ul>((String *)local_208,"%*s%s: ",(ulong)(iVar4 - 1)," ",pcVar8);
      ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_String,_Value>_>::operator->
                         ((_Rb_tree_const_iterator<std::pair<const_String,_Value>_> *)
                          ((long)&s.mString.field_2 + 8));
      end_1._M_current = (Value *)local_208;
      std::function<void(char_const*,unsigned_long)>::
      function<StringFormatter::format(Value_const&,std::function<void(char_const*,unsigned_long)>)const::_lambda(char_const*,unsigned_long)_1_,void>
                ((function<void(char_const*,unsigned_long)> *)&local_228,
                 (anon_class_8_1_54a39813 *)&end_1);
      (*(this->super_Formatter)._vptr_Formatter[2])(this,&ppVar6->second,&local_228);
      std::function<void_(const_char_*,_unsigned_long)>::~function(&local_228);
      pcVar8 = String::constData((String *)local_208);
      sVar9 = String::size((String *)local_208);
      std::function<void_(const_char_*,_unsigned_long)>::operator()(output,pcVar8,sVar9);
      std::function<void_(const_char_*,_unsigned_long)>::operator()(output,"\n",1);
      String::~String((String *)local_208);
      std::_Rb_tree_const_iterator<std::pair<const_String,_Value>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_String,_Value>_> *)
                 ((long)&s.mString.field_2 + 8));
    }
    this->indent = this->indent + -1;
    List<String>::~List((List<String> *)&it);
    break;
  case Type_List:
    cStack_238 = Value::listEnd(value);
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output,"[ ",1);
    it_1._M_current._7_1_ = 1;
    local_248._M_current = (Value *)Value::listBegin(value);
    while (bVar1 = __gnu_cxx::operator!=(&local_248,&stack0xfffffffffffffdc8), bVar1) {
      if ((it_1._M_current._7_1_ & 1) == 0) {
        std::function<void_(const_char_*,_unsigned_long)>::operator()(output,", ",1);
      }
      else {
        it_1._M_current._7_1_ = 0;
      }
      pVVar7 = __gnu_cxx::
               __normal_iterator<const_Value_*,_std::vector<Value,_std::allocator<Value>_>_>::
               operator*(&local_248);
      std::function<void_(const_char_*,_unsigned_long)>::function(&local_268,output);
      (*(this->super_Formatter)._vptr_Formatter[2])(this,pVVar7,&local_268);
      std::function<void_(const_char_*,_unsigned_long)>::~function(&local_268);
      __gnu_cxx::__normal_iterator<const_Value_*,_std::vector<Value,_std::allocator<Value>_>_>::
      operator++(&local_248);
    }
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output," ]",2);
    break;
  case Type_Date:
    local_290 = Value::toDate(value,UTC);
    t = Date::time(&local_290,(time_t *)0x1);
    String::formatTime(&local_288,t,DateTime);
    String::operator=((String *)local_40,&local_288);
    String::~String(&local_288);
  }
  bVar1 = String::isEmpty((String *)local_40);
  if (!bVar1) {
    pcVar8 = String::constData((String *)local_40);
    sVar9 = String::size((String *)local_40);
    std::function<void_(const_char_*,_unsigned_long)>::operator()(output,pcVar8,sVar9);
  }
  String::~String((String *)local_40);
  return;
}

Assistant:

virtual void format(const Value &value, std::function<void(const char *, size_t)> output) const
    {
        String str;
        switch (value.type()) {
        case Value::Type_Invalid:
        case Value::Type_Undefined:
            output("null", 4);
            break;
        case Value::Type_Boolean:
            if (value.toBool()) {
                output("true", 4);
            } else {
                output("false", 5);
            }
            break;
        case Value::Type_Integer: {
            char buf[128];
            const size_t w = snprintf(buf, sizeof(buf), "%d", value.toInteger());
            output(buf, w);
            break; }
        case Value::Type_Double: {
            char buf[128];
            const size_t w = snprintf(buf, sizeof(buf), "%g", value.toDouble());
            output(buf, w);
            break; }
        case Value::Type_String:
            str = value.toString();
            break;
        case Value::Type_Custom:
            str = value.toCustom()->toString();
            break;
        case Value::Type_Map: {
            const auto end = value.end();
            List<String> strings;
            ++indent;
            for (auto it = value.begin(); it != end; ++it) {
                // printf("%*s" "%s", indent, " ", string);
                String s = String::format<128>("%*s%s: ", indent - 1, " ", it->first.constData());
                format(it->second, [&s](const char *ch, size_t len) {
                        s.append(ch, len);
                    });
                output(s.constData(), s.size());
                output("\n", 1);
            }
            --indent;
            break; }
        case Value::Type_List: {
            const auto end = value.listEnd();
            output("[ ", 1);
            bool first = true;
            for (auto it = value.listBegin(); it != end; ++it) {
                if (!first) {
                    output(", ", 1);
                } else {
                    first = false;
                }
                format(*it, output);
            }
            output(" ]", 2);
            break; }
        case Value::Type_Date:
            str = String::formatTime(value.toDate().time());
            break;
        }
        if (!str.isEmpty())
            output(str.constData(), str.size());
    }